

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
          (RepeatedPtrFieldBase *this,void **our_elems,void **other_elems,int length,
          int already_allocated)

{
  Arena *pAVar1;
  GenericTypeHandler<google::protobuf::Message> *this_00;
  uint uVar2;
  Message *to;
  Message *extraout_RDX;
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  
  uVar2 = length;
  if (already_allocated < length) {
    uVar2 = already_allocated;
  }
  if (0 < (int)uVar2) {
    uVar4 = 0;
    to = (Message *)other_elems;
    do {
      GenericTypeHandler<google::protobuf::Message>::Merge
                ((GenericTypeHandler<google::protobuf::Message> *)other_elems[uVar4],
                 (Message *)our_elems[uVar4],to);
      uVar4 = uVar4 + 1;
      to = extraout_RDX;
    } while (uVar2 != uVar4);
  }
  if (already_allocated < length) {
    pAVar1 = this->arena_;
    lVar3 = 0;
    do {
      this_00 = (GenericTypeHandler<google::protobuf::Message> *)
                other_elems[already_allocated + lVar3];
      auVar5 = (**(code **)(*(long *)this_00 + 0x20))(this_00,pAVar1);
      GenericTypeHandler<google::protobuf::Message>::Merge(this_00,auVar5._0_8_,auVar5._8_8_);
      our_elems[already_allocated + lVar3] = auVar5._0_8_;
      lVar3 = lVar3 + 1;
    } while (length - already_allocated != (int)lVar3);
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFromInnerLoop(void** our_elems,
                                              void** other_elems, int length,
                                              int already_allocated) {
  // Split into two loops, over ranges [0, allocated) and [allocated, length),
  // to avoid a branch within the loop.
  for (int i = 0; i < already_allocated && i < length; i++) {
    // Already allocated: use existing element.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        reinterpret_cast<typename TypeHandler::Type*>(our_elems[i]);
    TypeHandler::Merge(*other_elem, new_elem);
  }
  Arena* arena = GetArenaNoVirtual();
  for (int i = already_allocated; i < length; i++) {
    // Not allocated: alloc a new element first, then merge it.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        TypeHandler::NewFromPrototype(other_elem, arena);
    TypeHandler::Merge(*other_elem, new_elem);
    our_elems[i] = new_elem;
  }
}